

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_arguments_and_rest.cpp
# Opt level: O0

void show_list<int,double>(int *value,double *args)

{
  ostream *poVar1;
  double *args_local;
  int *value_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*value);
  std::operator<<(poVar1,", ");
  show_list<double>(args);
  return;
}

Assistant:

void show_list(const T & value, const Args & ...args) { // unpack params pack, and apply 'const &' pattern
    std::cout << value << ", ";
    //  recursive calling this function, each time to decrease one arg
    show_list(args...);
}